

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

void __thiscall QTreeView::expandRecursively(QTreeView *this,QModelIndex *index,int depth)

{
  QLayout **this_00;
  QAbstractItemViewPrivate *this_01;
  Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
  *this_02;
  Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *pDVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  iterator iVar5;
  Node<QPersistentModelIndex,_QHashDummyValue> *pNVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long in_FS_OFFSET;
  bool bVar10;
  Bucket BVar11;
  value_type v;
  QModelIndex local_c8;
  QList<std::pair<QModelIndex,_int>_> local_a8;
  QPersistentModelIndex local_88;
  QHashDummyValue local_79;
  undefined1 local_78 [32];
  pair<QModelIndex,_int> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (-2 < depth) {
    this_01 = *(QAbstractItemViewPrivate **)
               &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget
                .field_0x8;
    QAbstractItemViewPrivate::doDelayedItemsLayout(this_01,0);
    expand(this,index);
    if (depth != 0) {
      local_a8.d.d = (Data *)0x0;
      local_a8.d.ptr = (pair<QModelIndex,_int> *)0x0;
      local_a8.d.size = 0;
      local_78._16_8_ = (index->m).ptr;
      local_78._0_4_ = index->r;
      local_78._4_4_ = index->c;
      local_78._8_8_ = index->i;
      local_78._24_8_ = local_78._24_8_ & 0xffffffff00000000;
      QtPrivate::QMovableArrayOps<std::pair<QModelIndex,int>>::
      emplace<std::pair<QModelIndex,int>const&>
                ((QMovableArrayOps<std::pair<QModelIndex,int>> *)&local_a8,0,
                 (pair<QModelIndex,_int> *)local_78);
      QList<std::pair<QModelIndex,_int>_>::end(&local_a8);
      if (local_a8.d.size != 0) {
        this_00 = &this_01[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                   super_QWidgetPrivate.layout;
        do {
          local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_78._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          iVar5 = QList<std::pair<QModelIndex,_int>_>::end(&local_a8);
          local_78._0_4_ = iVar5.i[-1].first.r;
          local_78._4_4_ = iVar5.i[-1].first.c;
          local_78._8_8_ = iVar5.i[-1].first.i;
          local_78._16_8_ = iVar5.i[-1].first.m.ptr;
          iVar7 = iVar5.i[-1].second;
          local_78._24_8_ = *(undefined8 *)&iVar5.i[-1].second;
          local_a8.d.size = local_a8.d.size + -1;
          iVar4 = (**(code **)(*(long *)this_01->model + 0x78))(this_01->model,local_78);
          if (0 < iVar4) {
            iVar7 = iVar7 + 1;
            iVar9 = 0;
            do {
              local_c8.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
              local_c8.r = -0x55555556;
              local_c8.c = -0x55555556;
              local_c8.i._0_4_ = 0xaaaaaaaa;
              local_c8.i._4_4_ = 0xaaaaaaaa;
              (**(code **)(*(long *)this_01->model + 0x60))
                        (&local_c8,this_01->model,iVar9,0,local_78);
              iVar8 = 4;
              if (((-1 < local_c8.r) && (-1 < local_c8.c)) && (local_c8.m.ptr == this_01->model)) {
                if (iVar7 < depth || depth == -1) {
                  local_58.first.m.ptr = local_c8.m.ptr;
                  local_58.first.c = local_c8.c;
                  local_58.first.r = local_c8.r;
                  local_58.first.i = CONCAT44(local_c8.i._4_4_,(undefined4)local_c8.i);
                  local_58.second = iVar7;
                  QtPrivate::QMovableArrayOps<std::pair<QModelIndex,int>>::
                  emplace<std::pair<QModelIndex,int>const&>
                            ((QMovableArrayOps<std::pair<QModelIndex,int>> *)&local_a8,
                             local_a8.d.size,&local_58);
                  QList<std::pair<QModelIndex,_int>_>::end(&local_a8);
                }
                if (local_c8.m.ptr == (QAbstractItemModel *)0x0) {
LAB_005afbc3:
                  local_58.first.m.ptr = local_c8.m.ptr;
                  local_58.first.c = local_c8.c;
                  local_58.first.r = local_c8.r;
                  local_58.first.i = CONCAT44(local_c8.i._4_4_,(undefined4)local_c8.i);
                  this_02 = *(Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                              **)(*(long *)(this_01->model + 8) + 0x90);
                  if (this_02 ==
                      (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                       *)0x0) goto LAB_005afc36;
                  BVar11 = QHashPrivate::
                           Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                           ::findBucket<QtPrivate::QModelIndexWrapper>
                                     (this_02,(QModelIndexWrapper *)&local_58);
                  if ((BVar11.span[BVar11.index] == (Span)0xff) ||
                     (*(long *)(BVar11.span + 0x80) == 0)) goto LAB_005afc36;
                  QPersistentModelIndex::QPersistentModelIndex(&local_88,&local_c8);
                  pDVar1 = (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)
                           this_01[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                           super_QWidgetPrivate.layout;
                  bVar2 = true;
                  bVar10 = true;
                  if (pDVar1 == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *
                                )0x0) goto LAB_005afc38;
                  pNVar6 = QHashPrivate::
                           Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
                           findNode<QPersistentModelIndex>(pDVar1,&local_88);
                  bVar10 = pNVar6 != (Node<QPersistentModelIndex,_QHashDummyValue> *)0x0;
                }
                else {
                  cVar3 = (**(code **)(*(long *)local_c8.m.ptr + 0x138))(local_c8.m.ptr,&local_c8);
                  if (-1 < cVar3) goto LAB_005afbc3;
LAB_005afc36:
                  bVar10 = false;
LAB_005afc38:
                  bVar2 = bVar10;
                  bVar10 = false;
                }
                if (bVar2) {
                  QPersistentModelIndex::~QPersistentModelIndex(&local_88);
                }
                iVar8 = 6;
                if (!bVar10) {
                  QPersistentModelIndex::QPersistentModelIndex
                            ((QPersistentModelIndex *)&local_58,&local_c8);
                  pDVar1 = (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)
                           *this_00;
                  if (pDVar1 != (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *
                                )0x0) {
                    pNVar6 = QHashPrivate::
                             Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
                             findNode<QPersistentModelIndex>
                                       (pDVar1,(QPersistentModelIndex *)&local_58);
                    if (pNVar6 != (Node<QPersistentModelIndex,_QHashDummyValue> *)0x0) {
                      QPersistentModelIndex::~QPersistentModelIndex
                                ((QPersistentModelIndex *)&local_58);
                      iVar8 = 0;
                      goto LAB_005afce9;
                    }
                  }
                  QHash<QPersistentModelIndex,QHashDummyValue>::emplace<QHashDummyValue_const&>
                            ((QHash<QPersistentModelIndex,QHashDummyValue> *)this_00,
                             (QPersistentModelIndex *)&local_58,&local_79);
                  QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_58);
                  local_58.first.r = 0;
                  local_58.first.c = 0;
                  iVar8 = 0;
                  local_58.first.i = (quintptr)&local_c8;
                  QMetaObject::activate((QObject *)this,&staticMetaObject,0,(void **)&local_58);
                }
              }
LAB_005afce9:
            } while (((iVar8 == 6) || (iVar8 == 0)) && (iVar9 = iVar9 + 1, iVar4 != iVar9));
          }
        } while (local_a8.d.size != 0);
      }
      if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,0x20,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeView::expandRecursively(const QModelIndex &index, int depth)
{
    Q_D(QTreeView);

    if (depth < -1)
        return;
    // do layouting only once after expanding is done
    d->doDelayedItemsLayout();
    expand(index);
    if (depth == 0)
        return;
    QStack<std::pair<QModelIndex, int>> parents;
    parents.push({index, 0});
    while (!parents.isEmpty()) {
        const std::pair<QModelIndex, int> elem = parents.pop();
        const QModelIndex &parent = elem.first;
        const int curDepth = elem.second;
        const int rowCount = d->model->rowCount(parent);
        for (int row = 0; row < rowCount; ++row) {
            const QModelIndex child = d->model->index(row, 0, parent);
            if (!d->isIndexValid(child))
                break;
            if (depth == -1 || curDepth + 1 < depth)
                parents.push({child, curDepth + 1});
            if (d->isIndexExpanded(child))
                continue;
            if (d->storeExpanded(child))
                emit expanded(child);
        }
    }
}